

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::asymm(SimpSolver *this,Var v,CRef cr)

{
  bool bVar1;
  CRef CVar2;
  anon_struct_4_5_613047fb_for_header *c;
  int i;
  ulong uVar3;
  Lit l;
  Lit p;
  lbool local_39;
  CRef local_38;
  Size local_34;
  
  c = (anon_struct_4_5_613047fb_for_header *)
      RegionAllocator<unsigned_int>::operator[](&(this->super_Solver).ca.ra,cr);
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x19b,"bool Minisat::SimpSolver::asymm(Var, CRef)");
  }
  if ((((uint)*c & 3) == 0) && (bVar1 = Solver::satisfied(&this->super_Solver,(Clause *)c), !bVar1))
  {
    local_34 = (this->super_Solver).trail.sz;
    local_38 = cr;
    vec<int,_int>::push(&(this->super_Solver).trail_lim,&local_34);
    l.x = -2;
    for (uVar3 = 0; uVar3 < (uint)*c >> 5; uVar3 = uVar3 + 1) {
      p.x = *(int *)(c + uVar3 + 1);
      if (p.x >> 1 != v) {
        local_39 = Solver::value(&this->super_Solver,p);
        bVar1 = lbool::operator!=(&local_39,l_False);
        p.x = *(int *)(c + uVar3 + 1);
        if (bVar1) {
          Solver::uncheckedEnqueue(&this->super_Solver,(Lit)(p.x ^ 1),0xffffffff);
          p.x = l.x;
        }
      }
      l.x = p.x;
    }
    CVar2 = Solver::propagate(&this->super_Solver);
    Solver::cancelUntil(&this->super_Solver,0);
    if (CVar2 != 0xffffffff) {
      this->asymm_lits = this->asymm_lits + 1;
      bVar1 = strengthenClause(this,local_38,l);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool SimpSolver::asymm(Var v, CRef cr)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);

    if (c.mark() || satisfied(c)) return true;

    trail_lim.push(trail.size());
    Lit l = lit_Undef;
    for (int i = 0; i < c.size(); i++)
        if (var(c[i]) != v && value(c[i]) != l_False)
            uncheckedEnqueue(~c[i]);
        else
            l = c[i];

    if (propagate() != CRef_Undef){
        cancelUntil(0);
        asymm_lits++;
        if (!strengthenClause(cr, l))
            return false;
    }else
        cancelUntil(0);

    return true;
}